

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ExprNew(Fts5Config *pConfig,int bPhraseToAnd,int iCol,char *zExpr,Fts5Expr **ppNew,
                      char **pzErr)

{
  char cVar1;
  short sVar2;
  Fts5Parse *pFVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  fts5yyParser *fts5yypParser_00;
  byte *pbVar9;
  Fts5ExprNode *pFVar10;
  Fts5ExprPhrase *pFVar11;
  Fts5Colset *pFVar12;
  Fts5ExprNode *p;
  Fts5ExprNearset *pFVar13;
  undefined1 *puVar14;
  fts5yyStackEntry *pfVar15;
  Fts5Colset *pFVar16;
  Fts5Expr *pFVar17;
  byte bVar18;
  Fts5ExprNode *pFVar19;
  Fts5ExprNode *pFVar20;
  long lVar21;
  uint uVar22;
  fts5YYMINORTYPE *extraout_RDX;
  char *pcVar23;
  fts5YYMINORTYPE *extraout_RDX_00;
  fts5YYMINORTYPE *extraout_RDX_01;
  fts5YYMINORTYPE *fts5yypminor;
  fts5YYMINORTYPE *extraout_RDX_02;
  fts5YYMINORTYPE *extraout_RDX_03;
  fts5YYMINORTYPE *extraout_RDX_04;
  fts5yyStackEntry *pfVar24;
  byte bVar25;
  ulong uVar26;
  fts5yyParser *fts5yypParser;
  long in_FS_OFFSET;
  uint local_c4;
  Fts5Colset *local_c0;
  int local_b8;
  Fts5Parse local_78;
  Fts5Colset *local_48;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *ppNew = (Fts5Expr *)0x0;
  *pzErr = (char *)0x0;
  local_78.apPhrase = (Fts5ExprPhrase **)0x0;
  local_78.pExpr = (Fts5ExprNode *)0x0;
  local_78.zErr = (char *)0x0;
  local_78.rc = 0;
  local_78.nPhrase = 0;
  local_78._44_4_ = 0;
  local_78.bPhraseToAnd = bPhraseToAnd;
  iVar7 = sqlite3_initialize();
  iVar8 = 7;
  if ((iVar7 != 0) ||
     (fts5yypParser_00 = (fts5yyParser *)sqlite3Malloc(0x980),
     fts5yypParser_00 == (fts5yyParser *)0x0)) goto LAB_001de707;
  fts5yypParser_00->fts5yystack = fts5yypParser_00->fts5yystk0;
  fts5yypParser_00->fts5yystackEnd = fts5yypParser_00->fts5yystk0 + 99;
  fts5yypParser_00->fts5yytos = fts5yypParser_00->fts5yystk0;
  fts5yypParser_00->fts5yystk0[0].stateno = '\0';
  fts5yypParser_00->fts5yystk0[0].major = '\0';
  pcVar23 = (char *)extraout_RDX;
  pFVar16 = (Fts5Colset *)zExpr;
  local_78.pConfig = pConfig;
  local_c0 = (Fts5Colset *)zExpr;
  do {
    while( true ) {
      bVar6 = (byte)pFVar16->nCol;
      if (0x1f < bVar6) break;
      pcVar23 = (char *)(ulong)(bVar6 - 9);
      if ((1 < bVar6 - 9) && (bVar6 != 0xd)) {
        if (bVar6 == 0) {
          local_c4 = 0;
          goto LAB_001ddf98;
        }
        goto switchD_001dde74_caseD_21;
      }
switchD_001dde74_caseD_20:
      zExpr = (char *)((long)&((Fts5Colset *)zExpr)->nCol + 1);
      pFVar16 = (Fts5Colset *)((long)&pFVar16->nCol + 1);
    }
    if (0x39 < bVar6) {
      if (bVar6 < 0x7b) {
        if (bVar6 == 0x3a) {
          local_c4 = 5;
        }
        else {
          if (bVar6 != 0x5e) goto switchD_001dde74_caseD_21;
          local_c4 = 0xc;
        }
      }
      else if (bVar6 == 0x7b) {
        local_c4 = 7;
      }
      else {
        if (bVar6 != 0x7d) goto switchD_001dde74_caseD_21;
        local_c4 = 8;
      }
      goto LAB_001ddf98;
    }
    uVar22 = bVar6 - 0x20;
    if (uVar22 < 0xe) {
      pcVar23 = (char *)((long)&switchD_001dde74::switchdataD_0020109c +
                        (long)(int)(&switchD_001dde74::switchdataD_0020109c)[uVar22]);
      switch((uint)bVar6) {
      case 0x20:
        goto switchD_001dde74_caseD_20;
      default:
        goto switchD_001dde74_caseD_21;
      case 0x22:
        pFVar12 = pFVar16;
        do {
          cVar1 = *(char *)((long)&pFVar12->nCol + 1);
          if (cVar1 == '\"') {
            if (*(char *)((long)&pFVar12->nCol + 2) != '\"') {
              puVar14 = (undefined1 *)((long)pFVar12 + (2 - (long)zExpr));
              local_b8 = (int)puVar14;
              local_c4 = 9;
              goto LAB_001ddfa3;
            }
            pFVar12 = (Fts5Colset *)((long)&pFVar12->nCol + 2);
          }
          else {
            pFVar12 = (Fts5Colset *)((long)&pFVar12->nCol + 1);
          }
        } while (cVar1 != '\0');
        sqlite3Fts5ParseError(&local_78,"unterminated string");
        pcVar23 = (char *)extraout_RDX_00;
        goto LAB_001ddf43;
      case 0x28:
        local_c4 = 10;
        break;
      case 0x29:
        local_c4 = 0xb;
        break;
      case 0x2a:
        local_c4 = 0xf;
        break;
      case 0x2b:
        local_c4 = 0xe;
        break;
      case 0x2c:
        local_c4 = 0xd;
        break;
      case 0x2d:
        local_c4 = 6;
      }
LAB_001ddf98:
      puVar14 = (undefined1 *)0x1;
      local_b8 = 1;
LAB_001ddfa3:
      local_c0 = (Fts5Colset *)((long)pFVar16->aiCol + (long)(int)puVar14 + -4);
    }
    else {
switchD_001dde74_caseD_21:
      if (((char)bVar6 < '\0') || ((&DAT_00206ae0)[bVar6] != '\0')) {
        puVar14 = (undefined1 *)0x1;
        while ((lVar21 = (long)*(char *)((long)pFVar16->aiCol + (long)(puVar14 + -4)), lVar21 < 0 ||
               (pcVar23 = &DAT_00206ae0, (&DAT_00206ae0)[lVar21] != '\0'))) {
          puVar14 = puVar14 + 1;
        }
        local_b8 = (int)puVar14;
        if (local_b8 == 2) {
          local_c4 = (uint)((short)pFVar16->nCol != 0x524f) * 8 + 1;
          local_b8 = 2;
        }
        else if (local_b8 == 3) {
          sVar2 = (short)pFVar16->nCol;
          cVar1 = *(char *)((long)&pFVar16->nCol + 2);
          local_b8 = 3;
          pcVar23 = (char *)0x9;
          if (cVar1 == 'T' && sVar2 == 0x4f4e) {
            pcVar23 = (char *)0x3;
          }
          if (cVar1 == 'D' && sVar2 == 0x4e41) {
            pcVar23 = (char *)0x2;
          }
          local_c4 = (uint)pcVar23;
        }
        else {
          local_c4 = 9;
        }
        goto LAB_001ddfa3;
      }
      sqlite3Fts5ParseError(&local_78,"fts5: syntax error near \"%.1s\"",pFVar16);
      pcVar23 = (char *)extraout_RDX_03;
LAB_001ddf43:
      local_c4 = 0;
      local_b8 = 1;
    }
    local_48 = (Fts5Colset *)&DAT_aaaaaaaaaaaaaaaa;
    iStack_40 = -0x55555556;
    uStack_3c = 0xaaaaaaaa;
    fts5yypParser_00->pParse = &local_78;
    pfVar24 = fts5yypParser_00->fts5yytos;
    bVar6 = pfVar24->stateno;
    while( true ) {
      bVar25 = (byte)local_c4;
      if (bVar6 < 0x23) {
        lVar21 = (ulong)",,,,,,3M+\f\x0eSR\x0e\x17\x17\x1f\x1fGJNQV[\x0655<@D5W\\5]"[bVar6] +
                 (ulong)local_c4;
        pbVar9 = "PPPPPP_PPiPnnPnnPPPPP[PPPedPPZgPPhP" + bVar6;
        if ("\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
            [lVar21] == bVar25) {
          pbVar9 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
                   + lVar21;
        }
        bVar6 = *pbVar9;
        pcVar23 = (char *)
                  "\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
        ;
      }
      if (bVar6 < 0x53) break;
      if (((bVar6 == 0x6e) || (bVar6 == 0x69)) && (fts5yypParser_00->fts5yystackEnd <= pfVar24))
      goto LAB_001de481;
      if (0x1b < bVar6 - 0x53) goto switchD_001de058_caseD_5f;
      pFVar3 = fts5yypParser_00->pParse;
      switch((uint)bVar6) {
      case 0x53:
        pFVar3->pExpr = (Fts5ExprNode *)(pfVar24->minor).fts5yy0.p;
        break;
      case 0x54:
        pFVar11 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar3,pfVar24[-1].minor.fts5yy11);
        goto LAB_001de21e;
      default:
        pFVar10 = (Fts5ExprNode *)pfVar24[-1].minor.fts5yy0.p;
        goto LAB_001de315;
      case 0x56:
      case 0x59:
        pFVar10 = (Fts5ExprNode *)
                  sqlite3Fts5ParseColset
                            (pFVar3,(Fts5Colset *)0x0,(Fts5Token *)(pfVar24->minor).fts5yy11);
        goto LAB_001de140;
      case 0x57:
        pFVar12 = sqlite3Fts5ParseColset
                            (pFVar3,(Fts5Colset *)0x0,(Fts5Token *)(pfVar24->minor).fts5yy11);
        pfVar24[-1].minor.fts5yy11 = pFVar12;
        pFVar11 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar3,pFVar12);
        goto LAB_001de272;
      case 0x58:
        pFVar11 = (Fts5ExprPhrase *)
                  sqlite3Fts5ParseColset
                            (pFVar3,pfVar24[-1].minor.fts5yy11,
                             (Fts5Token *)(pfVar24->minor).fts5yy11);
        goto LAB_001de272;
      case 0x5a:
        pFVar10 = pfVar24[-2].minor.fts5yy24;
        pFVar19 = (pfVar24->minor).fts5yy24;
        iVar8 = 2;
        goto LAB_001de306;
      case 0x5b:
        pFVar10 = pfVar24[-2].minor.fts5yy24;
        pFVar19 = (pfVar24->minor).fts5yy24;
        iVar8 = 1;
        goto LAB_001de306;
      case 0x5c:
        pFVar10 = pfVar24[-2].minor.fts5yy24;
        pFVar19 = (pfVar24->minor).fts5yy24;
        iVar8 = 3;
LAB_001de306:
        pFVar10 = sqlite3Fts5ParseNode(pFVar3,iVar8,pFVar10,pFVar19,(Fts5ExprNearset *)0x0);
LAB_001de315:
        pfVar24[-2].minor.fts5yy0.p = (char *)pFVar10;
        break;
      case 0x5d:
        sqlite3Fts5ParseSetColset(pFVar3,pfVar24[-1].minor.fts5yy24,pfVar24[-4].minor.fts5yy11);
        pcVar23 = pfVar24[-1].minor.fts5yy0.p;
        goto LAB_001de39c;
      case 0x5f:
      case 0x60:
        break;
      case 0x61:
        pFVar10 = pfVar24[-1].minor.fts5yy24;
        pFVar19 = (pfVar24->minor).fts5yy24;
        if (pFVar3->rc == 0) {
          p = pFVar10;
          if (pFVar10->eType == 2) {
            p = pFVar10->apChild[(long)pFVar10->nChild + -1];
          }
          if (pFVar19->eType == 0) {
            sqlite3Fts5ParseNodeFree(pFVar19);
            pFVar3->nPhrase = pFVar3->nPhrase + -1;
          }
          else if (p->eType == 0) {
            pFVar20 = pFVar19;
            if (p != pFVar10) {
              pFVar10->apChild[(long)pFVar10->nChild + -1] = pFVar19;
              pFVar20 = pFVar10;
            }
            uVar22 = pFVar19->pNear->nPhrase;
            lVar21 = (long)(int)(~uVar22 + pFVar3->nPhrase);
            memmove(pFVar3->apPhrase + lVar21,pFVar3->apPhrase + lVar21 + 1,(long)(int)uVar22 << 3);
            pFVar3->nPhrase = pFVar3->nPhrase + -1;
            sqlite3Fts5ParseNodeFree(p);
            pFVar10 = pFVar20;
          }
          else {
            pFVar10 = sqlite3Fts5ParseNode(pFVar3,2,pFVar10,pFVar19,(Fts5ExprNearset *)0x0);
          }
        }
        else {
          sqlite3Fts5ParseNodeFree(pFVar10);
          sqlite3Fts5ParseNodeFree(pFVar19);
          pFVar10 = (Fts5ExprNode *)0x0;
        }
        pfVar24[-1].minor.fts5yy0.p = (char *)pFVar10;
        break;
      case 0x62:
        pFVar10 = sqlite3Fts5ParseNode
                            (pFVar3,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                             (pfVar24->minor).fts5yy46);
        goto LAB_001de140;
      case 99:
        pFVar10 = sqlite3Fts5ParseNode
                            (pFVar3,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                             (pfVar24->minor).fts5yy46);
        sqlite3Fts5ParseSetColset(pFVar3,pFVar10,pfVar24[-2].minor.fts5yy11);
        pfVar24[-2].minor.fts5yy24 = pFVar10;
        break;
      case 100:
      case 0x67:
        pFVar10 = (Fts5ExprNode *)
                  sqlite3Fts5ParseNearset(pFVar3,(Fts5ExprNearset *)0x0,(pfVar24->minor).fts5yy53);
LAB_001de140:
        (pfVar24->minor).fts5yy46 = (Fts5ExprNearset *)pFVar10;
        break;
      case 0x65:
        pFVar11 = (pfVar24->minor).fts5yy53;
        if (pFVar11 == (Fts5ExprPhrase *)0x0) {
          pFVar11 = (Fts5ExprPhrase *)0x0;
        }
        else if (pFVar11->nTerm != 0) {
          pFVar11->aTerm[0].bFirst = '\x01';
          pFVar11 = (pfVar24->minor).fts5yy53;
        }
        pFVar13 = sqlite3Fts5ParseNearset(pFVar3,(Fts5ExprNearset *)0x0,pFVar11);
        pfVar24[-1].minor.fts5yy46 = pFVar13;
        break;
      case 0x66:
        if ((pfVar24[-4].minor.fts5yy0.n != 4) || ((pfVar24[-4].minor.fts5yy11)->nCol != 0x5241454e)
           ) {
          sqlite3Fts5ParseError(pFVar3,"fts5: syntax error near \"%.*s\"");
        }
        if (pfVar24[-2].minor.fts5yy11 != (Fts5Colset *)0x0) {
          uVar22 = pfVar24[-1].minor.fts5yy0.n;
          if ((ulong)uVar22 == 0) {
            iVar8 = 10;
          }
          else if ((int)uVar22 < 1) {
            iVar8 = 0;
          }
          else {
            uVar26 = 0;
            iVar8 = 0;
            do {
              bVar25 = pfVar24[-1].minor.fts5yy0.p[uVar26];
              if (9 < (byte)(bVar25 - 0x30)) {
                sqlite3Fts5ParseError(pFVar3,"expected integer, got \"%.*s\"");
                goto LAB_001de398;
              }
              iVar8 = (uint)bVar25 + iVar8 * 10 + -0x30;
              uVar26 = uVar26 + 1;
            } while (uVar22 != uVar26);
          }
          (pfVar24[-2].minor.fts5yy11)->nCol = iVar8;
        }
LAB_001de398:
        pcVar23 = pfVar24[-2].minor.fts5yy0.p;
LAB_001de39c:
        pfVar24[-4].minor.fts5yy0.p = pcVar23;
        break;
      case 0x68:
        pFVar11 = (Fts5ExprPhrase *)
                  sqlite3Fts5ParseNearset
                            (pFVar3,pfVar24[-1].minor.fts5yy46,(pfVar24->minor).fts5yy53);
        goto LAB_001de272;
      case 0x69:
        pfVar24[1].minor.fts5yy0.p = (char *)0x0;
        pfVar24[1].minor.fts5yy0.n = 0;
        break;
      case 0x6a:
        uVar4 = *(undefined4 *)((long)&pfVar24->minor + 4);
        iVar8 = (pfVar24->minor).fts5yy0.n;
        uVar5 = *(undefined4 *)((long)&pfVar24->minor + 0xc);
        pfVar24[-1].minor.fts5yyinit = (pfVar24->minor).fts5yyinit;
        *(undefined4 *)((long)&pfVar24[-1].minor + 4) = uVar4;
        pfVar24[-1].minor.fts5yy0.n = iVar8;
        *(undefined4 *)((long)&pfVar24[-1].minor + 0xc) = uVar5;
        break;
      case 0x6b:
        pFVar11 = sqlite3Fts5ParseTerm
                            (pFVar3,pfVar24[-3].minor.fts5yy53,&pfVar24[-1].minor.fts5yy0,
                             (pfVar24->minor).fts5yyinit);
LAB_001de21e:
        pfVar24[-3].minor.fts5yy53 = pFVar11;
        break;
      case 0x6c:
        pFVar11 = sqlite3Fts5ParseTerm
                            (pFVar3,(Fts5ExprPhrase *)0x0,&pfVar24[-1].minor.fts5yy0,
                             (pfVar24->minor).fts5yyinit);
LAB_001de272:
        pfVar24[-1].minor.fts5yy53 = pFVar11;
        break;
      case 0x6d:
        (pfVar24->minor).fts5yyinit = 1;
        break;
      case 0x6e:
        pfVar24[1].minor.fts5yyinit = 0;
      }
switchD_001de058_caseD_5f:
      uVar26 = (ulong)bVar6 + 0xffffffad & 0xffffffff;
      bVar25 = "\x10\x14\x14\x14\x14\x15\x15\x11\x11\x11\x11\x11\x11\x13\x13\x12\x12\x16\x16\x16\x17\x17\x19\x19\x18\x18\x1a\x1a"
               [uVar26];
      pfVar24 = pfVar24 + (long)fts5yyRuleInfoNRhs[uVar26] + 1;
      pcVar23 = fts5yy_reduce_ofst;
      bVar6 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
              [(long)fts5yy_reduce_ofst[pfVar24[-1].stateno] + (ulong)bVar25];
      fts5yypParser_00->fts5yytos = pfVar24;
      pfVar24->stateno = bVar6;
      pfVar24->major = bVar25;
    }
    if (0x4f < bVar6) {
      if (bVar6 == 0x51) {
        fts5yypParser_00->fts5yytos = pfVar24 + -1;
      }
      else {
        pFVar3 = fts5yypParser_00->pParse;
        local_48 = pFVar16;
        iStack_40 = local_b8;
        sqlite3Fts5ParseError(pFVar3,"fts5: syntax error near \"%.*s\"");
        fts5yypParser_00->pParse = pFVar3;
        fts5yy_destructor((fts5yyParser *)(ulong)bVar25,(uchar)&local_48,fts5yypminor);
        pcVar23 = (char *)extraout_RDX_02;
      }
      goto LAB_001de517;
    }
    fts5yypParser_00->fts5yytos = pfVar24 + 1;
    if (pfVar24 + 1 <= fts5yypParser_00->fts5yystackEnd) {
      bVar18 = bVar6 + 0x1f;
      if (bVar6 < 0x23) {
        bVar18 = bVar6;
      }
      pfVar24[1].stateno = bVar18;
      pfVar24[1].major = bVar25;
      pfVar24[1].minor.fts5yy11 = pFVar16;
      pfVar24[1].minor.fts5yy0.n = local_b8;
      goto LAB_001de517;
    }
    fts5yypParser_00->fts5yytos = pfVar24;
LAB_001de481:
    fts5yyStackOverflow(fts5yypParser_00);
    pcVar23 = (char *)extraout_RDX_01;
LAB_001de517:
  } while (((ulong)local_c4 != 0) &&
          (zExpr = (char *)local_c0, pFVar16 = local_c0, local_78.rc == 0));
  pfVar15 = fts5yypParser_00->fts5yystack;
  for (pfVar24 = fts5yypParser_00->fts5yytos; pfVar15 < pfVar24; pfVar24 = pfVar24 + -1) {
    if (0xf < pfVar24->major) {
      fts5yy_destructor((fts5yyParser *)(ulong)pfVar24->major,(char)pfVar24 + '\b',
                        (fts5YYMINORTYPE *)pcVar23);
      pfVar15 = fts5yypParser_00->fts5yystack;
      pcVar23 = (char *)extraout_RDX_04;
    }
  }
  sqlite3_free(fts5yypParser_00);
  if (local_78.rc == 0) {
    if ((iCol < pConfig->nCol) &&
       (pFVar16 = (Fts5Colset *)sqlite3Fts5MallocZero(&local_78.rc,8), pFVar16 != (Fts5Colset *)0x0)
       ) {
      pFVar16->nCol = 1;
      pFVar16->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&local_78,local_78.pExpr,pFVar16);
    }
    if (local_78.rc != 0) goto LAB_001de6da;
    iVar8 = sqlite3_initialize();
    if (iVar8 != 0) {
      *ppNew = (Fts5Expr *)0x0;
LAB_001de6d2:
      local_78.rc = 7;
      goto LAB_001de6da;
    }
    pFVar17 = (Fts5Expr *)sqlite3Malloc(0x28);
    *ppNew = pFVar17;
    if (pFVar17 == (Fts5Expr *)0x0) goto LAB_001de6d2;
    pFVar17->pRoot = local_78.pExpr;
    pFVar17->pIndex = (Fts5Index *)0x0;
    pFVar17->pConfig = pConfig;
    pFVar17->apExprPhrase = local_78.apPhrase;
    pFVar17->nPhrase = local_78.nPhrase;
    pFVar17->bDesc = 0;
    local_78.apPhrase = (Fts5ExprPhrase **)0x0;
  }
  else {
LAB_001de6da:
    sqlite3Fts5ParseNodeFree(local_78.pExpr);
  }
  sqlite3_free(local_78.apPhrase);
  if (*pzErr == (char *)0x0) {
    *pzErr = local_78.zErr;
  }
  else {
    sqlite3_free(local_78.zErr);
  }
  iVar8 = local_78.rc;
LAB_001de707:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

static int sqlite3Fts5ExprNew(
  Fts5Config *pConfig,            /* FTS5 Configuration */
  int bPhraseToAnd,
  int iCol,
  const char *zExpr,              /* Expression text */
  Fts5Expr **ppNew,
  char **pzErr
){
  Fts5Parse sParse;
  Fts5Token token;
  const char *z = zExpr;
  int t;                          /* Next token type */
  void *pEngine;
  Fts5Expr *pNew;

  *ppNew = 0;
  *pzErr = 0;
  memset(&sParse, 0, sizeof(sParse));
  sParse.bPhraseToAnd = bPhraseToAnd;
  pEngine = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  if( pEngine==0 ){ return SQLITE_NOMEM; }
  sParse.pConfig = pConfig;

  do {
    t = fts5ExprGetToken(&sParse, &z, &token);
    sqlite3Fts5Parser(pEngine, t, token, &sParse);
  }while( sParse.rc==SQLITE_OK && t!=FTS5_EOF );
  sqlite3Fts5ParserFree(pEngine, fts5ParseFree);

  assert( sParse.pExpr || sParse.rc!=SQLITE_OK );
  assert_expr_depth_ok(sParse.rc, sParse.pExpr);

  /* If the LHS of the MATCH expression was a user column, apply the
  ** implicit column-filter.  */
  if( sParse.rc==SQLITE_OK && iCol<pConfig->nCol ){
    int n = sizeof(Fts5Colset);
    Fts5Colset *pColset = (Fts5Colset*)sqlite3Fts5MallocZero(&sParse.rc, n);
    if( pColset ){
      pColset->nCol = 1;
      pColset->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&sParse, sParse.pExpr, pColset);
    }
  }

  assert( sParse.rc!=SQLITE_OK || sParse.zErr==0 );
  if( sParse.rc==SQLITE_OK ){
    *ppNew = pNew = sqlite3_malloc(sizeof(Fts5Expr));
    if( pNew==0 ){
      sParse.rc = SQLITE_NOMEM;
      sqlite3Fts5ParseNodeFree(sParse.pExpr);
    }else{
      pNew->pRoot = sParse.pExpr;
      pNew->pIndex = 0;
      pNew->pConfig = pConfig;
      pNew->apExprPhrase = sParse.apPhrase;
      pNew->nPhrase = sParse.nPhrase;
      pNew->bDesc = 0;
      sParse.apPhrase = 0;
    }
  }else{
    sqlite3Fts5ParseNodeFree(sParse.pExpr);
  }

  sqlite3_free(sParse.apPhrase);
  if( 0==*pzErr ){
    *pzErr = sParse.zErr;
  }else{
    sqlite3_free(sParse.zErr);
  }
  return sParse.rc;
}